

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_name_cmp(mbedtls_x509_name *a,mbedtls_x509_name *b)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  
  if (a != (mbedtls_x509_name *)0x0 || b != (mbedtls_x509_name *)0x0) {
    do {
      if (a == (mbedtls_x509_name *)0x0) {
        return -1;
      }
      if (b == (mbedtls_x509_name *)0x0) {
        return -1;
      }
      if ((a->oid).tag != (b->oid).tag) {
        return -1;
      }
      sVar4 = (a->oid).len;
      if (sVar4 != (b->oid).len) {
        return -1;
      }
      iVar6 = bcmp((a->oid).p,(b->oid).p,sVar4);
      if (iVar6 != 0) {
        return -1;
      }
      iVar6 = (a->val).tag;
      iVar3 = (b->val).tag;
      if (((iVar6 != iVar3) || (sVar4 = (a->val).len, sVar4 != (b->val).len)) ||
         (iVar7 = bcmp((a->val).p,(b->val).p,sVar4), iVar7 != 0)) {
        if ((iVar6 != 0x13) && (iVar6 != 0xc)) {
          return -1;
        }
        if ((iVar3 != 0x13) && (iVar3 != 0xc)) {
          return -1;
        }
        sVar5 = (a->val).len;
        if (sVar5 != (b->val).len) {
          return -1;
        }
        if (sVar5 != 0) {
          sVar8 = 0;
          do {
            bVar1 = (a->val).p[sVar8];
            bVar2 = (b->val).p[sVar8];
            if (bVar1 != bVar2) {
              if ((bVar2 ^ bVar1) != 0x20) {
                return -1;
              }
              if (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) {
                return -1;
              }
            }
            sVar8 = sVar8 + 1;
          } while (sVar5 != sVar8);
        }
      }
      if (a->next_merged != b->next_merged) {
        return -1;
      }
      a = a->next;
      b = b->next;
    } while (b != (mbedtls_asn1_named_data *)0x0 || a != (mbedtls_asn1_named_data *)0x0);
  }
  return 0;
}

Assistant:

static int x509_name_cmp( const mbedtls_x509_name *a, const mbedtls_x509_name *b )
{
    /* Avoid recursion, it might not be optimised by the compiler */
    while( a != NULL || b != NULL )
    {
        if( a == NULL || b == NULL )
            return( -1 );

        /* type */
        if( a->oid.tag != b->oid.tag ||
            a->oid.len != b->oid.len ||
            memcmp( a->oid.p, b->oid.p, b->oid.len ) != 0 )
        {
            return( -1 );
        }

        /* value */
        if( x509_string_cmp( &a->val, &b->val ) != 0 )
            return( -1 );

        /* structure of the list of sets */
        if( a->next_merged != b->next_merged )
            return( -1 );

        a = a->next;
        b = b->next;
    }

    /* a == NULL == b */
    return( 0 );
}